

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O1

void __thiscall Wave::set(Wave *this,uint index,uint pattern,bool value)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = (ulong)index;
  uVar5 = (ulong)pattern;
  lVar6 = (this->data).width * uVar7;
  puVar3 = (this->data).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((puVar3[uVar5 + lVar6] == '\0') == value) {
    puVar3[uVar5 + lVar6] = value;
    pdVar4 = (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4[uVar7] =
         pdVar4[uVar7] -
         (this->plogp_patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar5];
    pdVar4 = (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = pdVar4[uVar7] -
            (this->patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start[uVar5];
    pdVar4[uVar7] = dVar8;
    dVar8 = log(dVar8);
    (this->memoisation).log_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = dVar8;
    puVar1 = (this->memoisation).nb_patterns.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar7;
    *puVar1 = *puVar1 - 1;
    uVar2 = *puVar1;
    (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] =
         dVar8 - (this->memoisation).plogp_sum.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7] /
                 (this->memoisation).sum.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar7];
    if (uVar2 == 0) {
      this->is_impossible = true;
    }
  }
  return;
}

Assistant:

void Wave::set(unsigned index, unsigned pattern, bool value) noexcept {
  bool old_value = data.get(index, pattern);
  // If the value isn't changed, nothing needs to be done.
  if (old_value == value) {
    return;
  }
  // Otherwise, the memoisation should be updated.
  data.get(index, pattern) = value;
  memoisation.plogp_sum[index] -= plogp_patterns_frequencies[pattern];
  memoisation.sum[index] -= patterns_frequencies[pattern];
  memoisation.log_sum[index] = log(memoisation.sum[index]);
  memoisation.nb_patterns[index]--;
  memoisation.entropy[index] =
    memoisation.log_sum[index] -
    memoisation.plogp_sum[index] / memoisation.sum[index];
  // If there is no patterns possible in the cell, then there is a
  // contradiction.
  if (memoisation.nb_patterns[index] == 0) {
    is_impossible = true;
  }
}